

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall
polyscope::Histogram::buildHistogram
          (Histogram *this,vector<double,_std::allocator<double>_> *values,
          vector<double,_std::allocator<double>_> *weights)

{
  size_type sVar1;
  logic_error *this_00;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  pair<double,_double> *in_RDI;
  type_conflict in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  anon_class_32_4_d64c7edc buildCurve;
  size_t N;
  Histogram *in_stack_00000110;
  vector<double,_std::allocator<double>_> *in_stack_00000140;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *in_stack_00000148;
  bool in_stack_00000156;
  bool in_stack_00000157;
  size_t in_stack_00000158;
  anon_class_32_4_d64c7edc *in_stack_00000160;
  pair<double,_double> local_40 [2];
  size_type local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(in_RDX);
  *(bool *)&in_RDI[0xc].first = sVar1 != 0;
  *(byte *)((long)&in_RDI[0xc].first + 1) = *(byte *)&in_RDI[0xc].first & 1;
  local_20 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(local_10);
  sVar1 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(local_18);
  if (sVar1 != 0) {
    sVar1 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(local_18);
    if (sVar1 != local_20) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"values and weights are not same size");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  local_40[0] = robustMinMax<double>(in_stack_00000010,in_stack_00000008);
  std::pair<double,_double>::operator=(in_RDI + 0xb,local_40);
  std::pair<double,_double>::operator=(in_RDI,in_RDI + 0xb);
  buildHistogram::anon_class_32_4_d64c7edc::operator()
            (in_stack_00000160,in_stack_00000158,in_stack_00000157,in_stack_00000156,
             in_stack_00000148,in_stack_00000140);
  buildHistogram::anon_class_32_4_d64c7edc::operator()
            (in_stack_00000160,in_stack_00000158,in_stack_00000157,in_stack_00000156,
             in_stack_00000148,in_stack_00000140);
  if (((ulong)in_RDI[0xc].first & 1) != 0) {
    buildHistogram::anon_class_32_4_d64c7edc::operator()
              (in_stack_00000160,in_stack_00000158,in_stack_00000157,in_stack_00000156,
               in_stack_00000148,in_stack_00000140);
    buildHistogram::anon_class_32_4_d64c7edc::operator()
              (in_stack_00000160,in_stack_00000158,in_stack_00000157,in_stack_00000156,
               in_stack_00000148,in_stack_00000140);
  }
  fillBuffers(in_stack_00000110);
  return;
}

Assistant:

void Histogram::buildHistogram(std::vector<double>& values, const std::vector<double>& weights) {

  hasWeighted = weights.size() > 0;
  useWeighted = hasWeighted;

  // Build weighed and unweighted arrays of values
  size_t N = values.size();
  if (weights.size() != 0 && weights.size() != N) {
    throw std::logic_error("values and weights are not same size");
  }

  // == Build histogram
  dataRange = robustMinMax(values);
  colormapRange = dataRange;

  // Helper to build the four histogram variants
  auto buildCurve = [&](size_t binCount, bool weighted, bool smooth, std::vector<std::array<double, 2>>& curveX,
                        std::vector<double>& curveY) {
    // linspace coords
    double range = dataRange.second - dataRange.first;
    double inc = range / binCount;
    std::vector<double> sumBin(binCount, 0.0);

    // count values in buckets
    for (size_t iData = 0; iData < N; iData++) {

      double iBinf = binCount * (values[iData] - dataRange.first) / range;
      size_t iBin = std::floor(glm::clamp(iBinf, 0.0, (double)binCount - 1));

      // NaN values and finite values near the bottom of float range lead to craziness, so only increment bins if we got
      // something reasonable
      if (iBin < binCount) {
        if (weighted) {
          sumBin[iBin] += weights[iData];
        } else {
          sumBin[iBin] += 1.0;
        }
      }
    }


    // build histogram coords
    curveX = std::vector<std::array<double, 2>>(binCount);
    curveY = std::vector<double>(binCount);
    double prevSumU = 0.0;
    double prevSumW = 0.0;
    double prevXEnd = dataRange.first;
    for (size_t iBin = 0; iBin < binCount; iBin++) {
      // y value
      curveY[iBin] = sumBin[iBin];

      // x value
      double xEnd = prevXEnd + inc;
      curveX[iBin] = {{prevXEnd, xEnd}};
      prevXEnd = xEnd;
    }

    { // Rescale curves to [0,1] in both dimensions
      double maxHeight = *std::max_element(curveY.begin(), curveY.end());
      for (size_t i = 0; i < binCount; i++) {
        curveX[i][0] = (curveX[i][0] - dataRange.first) / range;
        curveX[i][1] = (curveX[i][1] - dataRange.first) / range;
        curveY[i] /= maxHeight;
      }
    }

    if (smooth) {
      smoothCurve(curveX, curveY);

      { // Rescale again after smoothing
        double maxHeight = *std::max_element(curveY.begin(), curveY.end());
        for (size_t i = 0; i < binCount; i++) {
          curveY[i] /= maxHeight;
        }
      }
    }
  };

  // Build the four variants of the curve
  buildCurve(rawHistBinCount, false, false, rawHistCurveX, unweightedRawHistCurveY);
  buildCurve(smoothedHistBinCount, false, true, smoothedHistCurveX, unweightedSmoothedHistCurveY);
  if (hasWeighted) {
    buildCurve(rawHistBinCount, true, false, rawHistCurveX, weightedRawHistCurveY);
    buildCurve(smoothedHistBinCount, true, true, smoothedHistCurveX, weightedSmoothedHistCurveY);
  }


  fillBuffers();
}